

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall pegmatite::Context::_parse_non_term(Context *this,Rule *r)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  ParseMatch local_90;
  undefined1 local_58 [8];
  ParserPosition b;
  bool ok;
  Rule *r_local;
  Context *this_local;
  
  get_parse_proc((parse_proc *)&b.line,this,r);
  bVar1 = std::function::operator_cast_to_bool((function *)&b.line);
  std::function<bool_(const_pegmatite::InputRange_&,_void_*)>::~function
            ((function<bool_(const_pegmatite::InputRange_&,_void_*)> *)&b.line);
  if (bVar1) {
    local_58 = (undefined1  [8])(this->position).it.buffer;
    b.it.buffer = (Input *)(this->position).it.idx;
    b.it.idx._0_4_ = (this->position).line;
    b.it.idx._4_4_ = (this->position).col;
    peVar5 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)r);
    uVar3 = (*peVar5->_vptr_Expr[2])(peVar5,this);
    bVar2 = (byte)uVar3;
    if ((uVar3 & 1) != 0) {
      anon_unknown.dwarf_50a29::ParseMatch::ParseMatch
                (&local_90,r,(ParserPosition *)local_58,&this->position);
      std::
      vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::push_back(&this->matches,&local_90);
    }
  }
  else {
    peVar5 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)r);
    iVar4 = (*peVar5->_vptr_Expr[2])(peVar5,this);
    bVar2 = (byte)iVar4;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Context::_parse_non_term(const Rule &r)
{
	bool ok;
	if (get_parse_proc(r))
	{
		ParserPosition b = position;
		ok = r.expr->parse_non_term(*this);
		if (debug_parsing)
		{
			r.expr->dump();
			fprintf(stderr, "\n");
		}
		if (ok)
		{
			matches.push_back(ParseMatch(std::addressof(r), b, position));
		}
	}
	else
	{
		ok = r.expr->parse_non_term(*this);
	}
	return ok;
}